

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O3

InstId asmjit::_abi_1_10::x86::InstInternal::stringToInstId(Arch arch,char *s,size_t len)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  char nameData [32];
  
  lVar15 = 0;
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if (0xffffffffffffffee < len - 0x12) {
      bVar1 = *s;
      uVar3 = (int)(char)bVar1 - 0x61;
      if (uVar3 < 0x1a) {
        uVar14 = (ulong)*(ushort *)(InstDB::instNameIndex + (ulong)uVar3 * 4);
        lVar15 = 0;
        if (uVar14 != 0) {
          if (*(ushort *)(InstDB::instNameIndex + (ulong)uVar3 * 4 + 2) - uVar14 != 0) {
            uVar13 = *(ushort *)(InstDB::instNameIndex + (ulong)uVar3 * 4 + 2) - uVar14;
            do {
              uVar6 = uVar13 >> 1;
              lVar15 = uVar6 + uVar14;
              uVar3 = *(uint *)(InstDB::_instNameIndexTable + lVar15 * 4);
              if ((int)uVar3 < 0) {
                uVar12 = 0;
                do {
                  uVar11 = uVar3 & 0x1f;
                  if (uVar11 == 0) goto LAB_00114393;
                  cVar7 = (char)uVar11 + '`';
                  if (0x1a < uVar11) {
                    cVar7 = (char)uVar11 + '\x15';
                  }
                  nameData[uVar12] = cVar7;
                  uVar12 = uVar12 + 1;
                  uVar3 = uVar3 >> 5;
                } while (uVar12 != 6);
                uVar12 = 6;
              }
              else {
                uVar11 = uVar3 >> 0xc & 0xf;
                uVar12 = (ulong)uVar11;
                if (uVar11 != 0) {
                  memcpy(nameData,"vgf2p8affineinvqbvaeskeygenassistvbroadcastf32x464x264x4i32x2i32x4i32x8i64x2i64x4vpbroadcastmb2w2d128i128vcvtne2ps2bf1vfmaddsub132ph213pd213ph213ps231pd231ph231psvfmsubadd132vpmultishiftvscatterpf0dqpdqps1dpd1dps1qpd1qpsvcvtneps2bf1vextracvextractfvgatherpf0vp2intersectsdvfnmadd132213sd213sh213ss231sd231sh231ssvfnmsub132vinservinsertfvpshufbitqprefetchntwt1saveprevsssha256rndtileloaddtilereleavaesdeclvaesenclvcompressvcvttpd2uqqvcvttph2uvcvttps2uvcvttsd2uvcvttsh2uvcvttss2uvfixupimmvfmadd132vfmsub132vmaskmovdqvpcompressvpconflictvphminposuvpmadd52hluqvpscatterqdvpunpckhqlqdqvrndscaleclflushopcmpxchg16t0t2msg1msg2tilestorev4fnmaddssvcvtpd2uvcvtph2psudqvcvtps2phvcvtsd2uvcvtsh2uvcvtss2uvcvtudq2vcvtuqq2vcvtusi2vfcmaddcvfpclassvgetmanmulbvp4dpwssvpclmuvpcmpestrvpcmpistrvperm2fvpermil2vpgathervpmacssdqvpmadcsswubswvpmaskmovpternlogbwwdlbwldqlwdvrsqrt1428pd28ps28sd28ssvshufvshuffvzeroupxsaveopt8bfxrstorldtilecfmovdir64pvalidarmpadjurmpupdaserialisha1nexsha1rndssttilecftdpbf16v4fmadvaddsubvblendmvpdvcvtdq2uwvcvtqq2vcvtsi2vcvtuwvdbpsadvdpbf16vexpanvfcmulccphcshvgetexpvmovdqau16u32u64vmovmskvmovntvmovshdvmovsldvpackssdwbvpackuswbvpblendmdvpdpbusvpdpwss2pdvpermtvpexpanvphaddubwqdqhvpmovmskvpmovsxbvpmovusqwvpmovzxbvpmulhrvptestnmqvreducevscalefvunpckhlpdlpsxresldtrs64xsusldtrcldemoclrssbscvtpifcmovnbfxsavekortestkshiftrbkunpckmonitorpfrcpipfrsqirtvrdfsbrdgsbsspsenduisetssbssysesysexvcvtwvfmulvldmxcsvmlaundupu8vmovhvmovlhvmpsadvmresumvpadduvpaligngtbgtdgtqgtw2qbdbqvphsubvplzcnb2md2mq2mw2mvpopcnvpshldvqvpshrdvwhwvpsubuvrangevrcp14vroundsdvstmxcsvucomiallwbnoinwrfsbwrgsbc64blcfiblsfiendbrenqcmbefdecsfincsfnstefrndfsincfucomppfyl2xincsspqinvlinvpcinvvpmcommmovq2pavgupfcmpepfpnaptwrisyscsysretdpbuvaesivaligvandnvcomivfrczvhadvhsubvmclevmmcvmovavmovuvmptvmwrivpandvpextrwvpinsvpmaxvpminvprolvprorvpsadvpsigvpslvpsllvpsravpsrlvsqrvtes"
                                  + (uVar3 & 0xfff),uVar12);
                }
                if (0xfffffff < uVar3) {
                  memcpy(nameData + uVar12,
                         "vgf2p8affineinvqbvaeskeygenassistvbroadcastf32x464x264x4i32x2i32x4i32x8i64x2i64x4vpbroadcastmb2w2d128i128vcvtne2ps2bf1vfmaddsub132ph213pd213ph213ps231pd231ph231psvfmsubadd132vpmultishiftvscatterpf0dqpdqps1dpd1dps1qpd1qpsvcvtneps2bf1vextracvextractfvgatherpf0vp2intersectsdvfnmadd132213sd213sh213ss231sd231sh231ssvfnmsub132vinservinsertfvpshufbitqprefetchntwt1saveprevsssha256rndtileloaddtilereleavaesdeclvaesenclvcompressvcvttpd2uqqvcvttph2uvcvttps2uvcvttsd2uvcvttsh2uvcvttss2uvfixupimmvfmadd132vfmsub132vmaskmovdqvpcompressvpconflictvphminposuvpmadd52hluqvpscatterqdvpunpckhqlqdqvrndscaleclflushopcmpxchg16t0t2msg1msg2tilestorev4fnmaddssvcvtpd2uvcvtph2psudqvcvtps2phvcvtsd2uvcvtsh2uvcvtss2uvcvtudq2vcvtuqq2vcvtusi2vfcmaddcvfpclassvgetmanmulbvp4dpwssvpclmuvpcmpestrvpcmpistrvperm2fvpermil2vpgathervpmacssdqvpmadcsswubswvpmaskmovpternlogbwwdlbwldqlwdvrsqrt1428pd28ps28sd28ssvshufvshuffvzeroupxsaveopt8bfxrstorldtilecfmovdir64pvalidarmpadjurmpupdaserialisha1nexsha1rndssttilecftdpbf16v4fmadvaddsubvblendmvpdvcvtdq2uwvcvtqq2vcvtsi2vcvtuwvdbpsadvdpbf16vexpanvfcmulccphcshvgetexpvmovdqau16u32u64vmovmskvmovntvmovshdvmovsldvpackssdwbvpackuswbvpblendmdvpdpbusvpdpwss2pdvpermtvpexpanvphaddubwqdqhvpmovmskvpmovsxbvpmovusqwvpmovzxbvpmulhrvptestnmqvreducevscalefvunpckhlpdlpsxresldtrs64xsusldtrcldemoclrssbscvtpifcmovnbfxsavekortestkshiftrbkunpckmonitorpfrcpipfrsqirtvrdfsbrdgsbsspsenduisetssbssysesysexvcvtwvfmulvldmxcsvmlaundupu8vmovhvmovlhvmpsadvmresumvpadduvpaligngtbgtdgtqgtw2qbdbqvphsubvplzcnb2md2mq2mw2mvpopcnvpshldvqvpshrdvwhwvpsubuvrangevrcp14vroundsdvstmxcsvucomiallwbnoinwrfsbwrgsbc64blcfiblsfiendbrenqcmbefdecsfincsfnstefrndfsincfucomppfyl2xincsspqinvlinvpcinvvpmcommmovq2pavgupfcmpepfpnaptwrisyscsysretdpbuvaesivaligvandnvcomivfrczvhadvhsubvmclevmmcvmovavmovuvmptvmwrivpandvpextrwvpinsvpmaxvpminvprolvprorvpsadvpsigvpslvpsllvpsravpsrlvsqrvtes"
                         + (uVar3 >> 0x10 & 0xfff),(ulong)(uVar3 >> 0x1c));
                }
                uVar12 = uVar12 + (uVar3 >> 0x1c);
              }
LAB_00114393:
              uVar4 = len;
              if (uVar12 < len) {
                uVar4 = uVar12;
              }
              if (uVar4 == 0) {
                iVar9 = (int)len - (int)uVar12;
              }
              else if (bVar1 == nameData[0]) {
                uVar5 = 1;
                bVar10 = bVar1;
                bVar8 = bVar1;
                if (uVar4 != 1) {
                  do {
                    bVar10 = s[uVar5];
                    bVar8 = nameData[uVar5];
                    if (bVar10 != nameData[uVar5]) break;
                    uVar5 = uVar5 + 1;
                    bVar8 = bVar10;
                  } while (uVar4 != uVar5);
                }
                iVar9 = (int)len - (int)uVar12;
                if (uVar5 < uVar4) {
                  iVar9 = (uint)bVar10 - (uint)bVar8;
                }
              }
              else {
                iVar9 = (uint)bVar1 - (uint)(byte)nameData[0];
              }
              if (-1 < iVar9) {
                if (iVar9 == 0) goto LAB_00114423;
                uVar14 = lVar15 + 1;
                uVar13 = uVar13 - 1;
                uVar6 = uVar13 >> 1;
              }
              bVar2 = 1 < uVar13;
              uVar13 = uVar6;
            } while (bVar2);
          }
          lVar15 = 0;
        }
      }
    }
  }
LAB_00114423:
  return (InstId)lVar15;
}

Assistant:

InstId InstInternal::stringToInstId(Arch arch, const char* s, size_t len) noexcept {
  DebugUtils::unused(arch);

  if (ASMJIT_UNLIKELY(!s))
    return Inst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > InstDB::kMaxNameSize))
    return Inst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  size_t base = InstDB::instNameIndex[prefix].start;
  size_t end = InstDB::instNameIndex[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return Inst::kIdNone;

  char nameData[32];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = Support::decodeInstName(nameData, InstDB::_instNameIndexTable[instId], InstDB::_instNameStringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return Inst::kIdNone;
}